

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryEncoder.cc
# Opt level: O0

void __thiscall avro::BinaryEncoder::encodeString(BinaryEncoder *this,string *s)

{
  size_t n;
  uint8_t *b;
  StreamWriter *in_RSI;
  long in_RDI;
  BinaryEncoder *unaff_retaddr;
  long l;
  
  l = in_RDI;
  std::__cxx11::string::size();
  doEncodeLong(unaff_retaddr,l);
  n = in_RDI + 8;
  b = (uint8_t *)std::__cxx11::string::c_str();
  std::__cxx11::string::size();
  StreamWriter::writeBytes(in_RSI,b,n);
  return;
}

Assistant:

void BinaryEncoder::encodeString(const std::string& s)
{
    doEncodeLong(s.size());
    out_.writeBytes(reinterpret_cast<const uint8_t*>(s.c_str()), s.size());
}